

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O2

void deblock_edge_luma_hor(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  pel *ppVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  uint local_b0;
  
  uVar19 = (ulong)((~edge_flag & 1U) << 2);
  lVar9 = (long)stride;
  lVar21 = (long)(stride * 2);
  lVar20 = uVar19 - (long)(stride * 3);
  lVar26 = uVar19 - lVar9;
  lVar27 = uVar19 - lVar21;
  lVar8 = 0;
  ppVar23 = src + uVar19;
  do {
    if ((uint)((~edge_flag & 0x101U) == 0) * 4 + 4 == (int)lVar8) {
      return;
    }
    pbVar10 = src + uVar19 + lVar8;
    bVar6 = src[lVar8 + lVar20];
    bVar1 = src[lVar8 + lVar27];
    bVar2 = src[lVar8 + lVar26];
    uVar24 = (uint)bVar2;
    bVar3 = *pbVar10;
    uVar12 = (uint)bVar3;
    bVar4 = src[lVar8 + uVar19 + lVar9];
    bVar5 = src[lVar8 + uVar19 + lVar21];
    uVar14 = (uint)bVar3 - (uint)bVar2;
    uVar18 = -uVar14;
    if (0 < (int)uVar14) {
      uVar18 = uVar14;
    }
    uVar15 = (uint)bVar1 - (uint)bVar2;
    uVar14 = -uVar15;
    if (0 < (int)uVar15) {
      uVar14 = uVar15;
    }
    uVar16 = (uint)bVar3 - (uint)bVar4;
    uVar15 = -uVar16;
    if (0 < (int)uVar16) {
      uVar15 = uVar16;
    }
    uVar25 = (uint)bVar2;
    uVar22 = bVar6 - uVar25;
    uVar16 = -uVar22;
    if (0 < (int)uVar22) {
      uVar16 = uVar22;
    }
    uVar13 = (uint)bVar3;
    uVar7 = uVar12 - bVar5;
    uVar22 = -uVar7;
    if (0 < (int)uVar7) {
      uVar22 = uVar7;
    }
    iVar11 = (uint)((int)(uVar16 & 0xff) < Beta) + (uint)((int)(uVar14 & 0xff) < Beta) * 2;
    iVar17 = (uint)((int)(uVar22 & 0xff) < Beta) + iVar11 + (uint)((int)(uVar15 & 0xff) < Beta) * 2;
    if (3 < iVar17 - 3U) goto LAB_0011301d;
    uVar14 = (uint)bVar3;
    uVar16 = (uint)bVar1;
    switch(iVar17) {
    case 3:
      local_b0 = (uint)bVar4;
      iVar17 = uVar16 - local_b0;
      iVar11 = -iVar17;
      if (0 < iVar17) {
        iVar11 = iVar17;
      }
      if (Beta <= iVar11) goto LAB_0011301d;
LAB_00112ff6:
      src[lVar8 + lVar26] = (pel)(uVar24 * 3 + uVar14 + 2 >> 2);
      bVar6 = (byte)(uVar12 * 3 + (uint)bVar2 + 2 >> 2);
      break;
    case 4:
      if (iVar11 != 2) goto LAB_00112ff6;
      goto LAB_00112fbd;
    case 5:
      if ((bVar4 == bVar3) && (bVar2 == bVar1)) goto LAB_00112f33;
LAB_00112fbd:
      src[lVar8 + lVar26] =
           (pel)((uint)bVar1 + (uint)bVar1 * 2 + uVar14 + (uint)bVar2 * 10 + uVar12 * 2 + 8 >> 4);
      bVar6 = (byte)(uVar24 * 3 + uVar12 * 10 + (uint)bVar4 * 3 + 8 >> 4);
      break;
    case 6:
      if ((int)(uVar15 & 0xff) <= Beta / 4) {
        uVar22 = uVar25 - bVar1;
        uVar15 = -uVar22;
        if (0 < (int)uVar22) {
          uVar15 = uVar22;
        }
        if ((uVar15 <= (uint)(Beta / 4)) && ((int)(uVar18 & 0xff) < Alpha)) {
          bVar2 = src[lVar8 + uVar19 + (long)(stride * 3)];
          iVar11 = (uint)bVar1 + (uint)bVar6;
          src[lVar8 + lVar20] =
               (pel)(uVar24 + ((uint)src[lVar8 + (long)(stride * -4) + uVar19] + iVar11) * 2 +
                     uVar13 + 4 >> 3);
          src[lVar8 + lVar27] = (pel)(uVar12 * 3 + uVar16 + (iVar11 + uVar25) * 4 + 8 >> 4);
          uVar18 = (uint)bVar4;
          iVar11 = uVar25 + uVar13;
          src[lVar8 + lVar26] =
               (pel)((bVar6 + uVar18) * 3 + (iVar11 + (uint)bVar1) * 8 + uVar24 * 2 + 0x10 >> 5);
          uVar14 = (uint)bVar5;
          *pbVar10 = (byte)((uVar16 + uVar14) * 3 + (iVar11 + uVar18) * 8 + uVar12 * 2 + 0x10 >> 5);
          src[lVar8 + uVar19 + lVar9] =
               (pel)(uVar24 * 3 + (uint)bVar4 + (uVar13 + uVar18 + uVar14) * 4 + 8 >> 4);
          pbVar10 = ppVar23 + lVar21;
          bVar6 = (byte)(iVar11 + (uVar14 + bVar4 + (uint)bVar2) * 2 + 4 >> 3);
          break;
        }
      }
LAB_00112f33:
      src[lVar8 + lVar27] =
           (pel)((uint)bVar6 * 3 + (uint)bVar2 * 4 + 8 + (uint)bVar1 * 8 + uVar14 >> 4);
      src[lVar8 + lVar26] =
           (pel)((uint)bVar6 + (uint)bVar1 * 4 + (uint)bVar2 * 4 + 8 + (uint)bVar2 * 2 +
                 (uint)bVar3 * 4 + (uint)bVar4 >> 4);
      *pbVar10 = (byte)((uint)bVar1 + (uint)bVar2 * 4 + 8 + uVar12 * 6 + (uint)bVar4 * 4 +
                        (uint)bVar5 >> 4);
      pbVar10 = ppVar23 + lVar9;
      bVar6 = (byte)(uVar24 + uVar12 * 4 + (uint)bVar4 * 8 + (uint)bVar5 + (uint)bVar5 * 2 + 8 >> 4)
      ;
    }
    *pbVar10 = bVar6;
LAB_0011301d:
    ppVar23 = ppVar23 + 1;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void deblock_edge_luma_hor(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int inc4 = inc + inc3;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4;
    }

    for (i = 0; i < line_size; i++, src++) {
        int L3 = src[-inc4];
        int L2 = src[-inc3];
        int L1 = src[-inc2];
        int L0 = src[-inc];
        int R0 = src[0];
        int R1 = src[inc];
        int R2 = src[inc2];
        int R3 = src[inc3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-inc3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                         //L2
            src[-inc2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                     //L1
            src[-inc ] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);      //L0
            src[ 0   ] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);      //R0
            src[ inc ] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                     //R1
            src[ inc2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                         //R2
            break;
        case 3:
            src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-inc ] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0   ] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ inc ] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R2
            break;
        case 2:
            src[-inc] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-inc] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}